

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O0

JavascriptNativeFloatArray *
Js::JavascriptNativeIntArray::ToNativeFloatArray(JavascriptNativeIntArray *intArray)

{
  uint32 left_00;
  uint32 length_00;
  uint uVar1;
  SparseArraySegmentBase *nextSeg_00;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  uint sourceContextId;
  LocalFunctionId functionId;
  int iVar5;
  ThreadContext *pTVar6;
  ArrayCallSiteInfo *this;
  ScriptContext *scriptContext_00;
  undefined4 *puVar7;
  FunctionBody *pFVar8;
  Recycler *recycler_00;
  SparseArraySegmentBase **ppSVar9;
  SparseArraySegmentBase *segment;
  SparseArraySegmentBase *pSVar10;
  SegmentBTreeRoot *this_00;
  DynamicType *pDVar11;
  JavascriptLibrary *pJVar12;
  DynamicType *pDVar13;
  DynamicTypeHandler *pDVar14;
  Type *this_01;
  DynamicTypeHandler *typeHandler;
  SegmentBTree *segmentMap;
  SparseArraySegment<double> *newSeg;
  uint32 newSegSize;
  int32 ival;
  int i;
  uint32 length;
  uint32 left;
  uint32 size;
  SparseArraySegmentBase *prevSeg;
  SparseArraySegmentBase *nextSeg;
  SparseArraySegmentBase *seg;
  Recycler *recycler;
  AutoDisableInterrupt failFastError;
  JavascriptFunction *pJStack_100;
  bool foundScriptCaller;
  JavascriptFunction *caller;
  JavascriptStackWalker walker;
  ArrayCallSiteInfo *arrayInfo;
  JsReentLock reentrancylock;
  ScriptContext *scriptContext;
  JavascriptNativeIntArray *intArray_local;
  
  reentrancylock._24_8_ = RecyclableObject::GetScriptContext((RecyclableObject *)intArray);
  pTVar6 = ScriptContext::GetThreadContext((ScriptContext *)reentrancylock._24_8_);
  JsReentLock::JsReentLock((JsReentLock *)&arrayInfo,pTVar6);
  this = JavascriptNativeArray::GetArrayCallSiteInfo(&intArray->super_JavascriptNativeArray);
  if (this != (ArrayCallSiteInfo *)0x0) {
    scriptContext_00 = RecyclableObject::GetScriptContext((RecyclableObject *)intArray);
    JavascriptStackWalker::JavascriptStackWalker
              ((JavascriptStackWalker *)&caller,scriptContext_00,true,(PVOID)0x0,false);
    pJStack_100 = (JavascriptFunction *)0x0;
    failFastError._15_1_ = 0;
    do {
      BVar4 = JavascriptStackWalker::GetCaller
                        ((JavascriptStackWalker *)&caller,&stack0xffffffffffffff00,true);
      if (BVar4 == 0) goto LAB_010c4f4d;
    } while ((pJStack_100 == (JavascriptFunction *)0x0) ||
            (BVar4 = ScriptFunction::Test(pJStack_100), BVar4 == 0));
    failFastError._15_1_ = 1;
LAB_010c4f4d:
    if ((failFastError._15_1_ & 1) == 0) {
      bVar3 = Phases::IsEnabled((Phases *)&DAT_01ec1678,NativeArrayConversionPhase);
      if (bVar3) {
        Output::Print(L"Conversion: Int array to Float array across ScriptContexts");
        Output::Flush();
      }
    }
    else {
      if (pJStack_100 == (JavascriptFunction *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                    ,0x68d,"(caller)","caller");
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 0;
      }
      pFVar8 = JavascriptFunction::GetFunctionBody(pJStack_100);
      if (pFVar8 == (FunctionBody *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                    ,0x68e,"(caller->GetFunctionBody())","caller->GetFunctionBody()"
                                   );
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 0;
      }
      pFVar8 = JavascriptFunction::GetFunctionBody(pJStack_100);
      sourceContextId = FunctionProxy::GetSourceContextId((FunctionProxy *)pFVar8);
      pFVar8 = JavascriptFunction::GetFunctionBody(pJStack_100);
      functionId = FunctionProxy::GetLocalFunctionId((FunctionProxy *)pFVar8);
      bVar3 = Phases::IsEnabled((Phases *)&DAT_01ec1678,NativeArrayConversionPhase,sourceContextId,
                                functionId);
      if (bVar3) {
        Output::Print(L"Conversion: Int array to Float array    ArrayCreationFunctionNumber:%2d    CallSiteNumber:%2d \n"
                      ,(ulong)this->functionNumber,(ulong)this->callSiteNumber);
        Output::Flush();
      }
    }
    ArrayCallSiteInfo::SetIsNotNativeIntArray(this);
    JavascriptStackWalker::~JavascriptStackWalker((JavascriptStackWalker *)&caller);
  }
  pTVar6 = ScriptContext::GetThreadContext((ScriptContext *)reentrancylock._24_8_);
  AutoDisableInterrupt::AutoDisableInterrupt((AutoDisableInterrupt *)&recycler,pTVar6,true);
  recycler_00 = ScriptContext::GetRecycler((ScriptContext *)reentrancylock._24_8_);
  _left = (SparseArraySegmentBase *)0x0;
  ppSVar9 = Memory::WriteBarrierPtr::operator_cast_to_SparseArraySegmentBase__
                      ((WriteBarrierPtr *)
                       &(intArray->super_JavascriptNativeArray).super_JavascriptArray.head);
  nextSeg_00 = *ppSVar9;
  do {
    while( true ) {
      do {
        nextSeg = nextSeg_00;
        if (nextSeg == (SparseArraySegmentBase *)0x0) {
          pDVar11 = (DynamicType *)RecyclableObject::GetType((RecyclableObject *)intArray);
          pJVar12 = ScriptContext::GetLibrary((ScriptContext *)reentrancylock._24_8_);
          pDVar13 = JavascriptLibrary::GetNativeIntArrayType(pJVar12);
          if (pDVar11 == pDVar13) {
            pJVar12 = ScriptContext::GetLibrary((ScriptContext *)reentrancylock._24_8_);
            pDVar11 = JavascriptLibrary::GetNativeFloatArrayType(pJVar12);
            Memory::WriteBarrierPtr<Js::Type>::operator=
                      (&(intArray->super_JavascriptNativeArray).super_JavascriptArray.
                        super_ArrayObject.super_DynamicObject.super_RecyclableObject.type,
                       &pDVar11->super_Type);
          }
          else {
            pDVar11 = DynamicObject::GetDynamicType((DynamicObject *)intArray);
            bVar3 = DynamicType::GetIsLocked(pDVar11);
            if (bVar3) {
              pDVar11 = DynamicObject::GetDynamicType((DynamicObject *)intArray);
              pDVar14 = DynamicType::GetTypeHandler(pDVar11);
              iVar5 = (*pDVar14->_vptr_DynamicTypeHandler[0x4e])();
              if (iVar5 == 0) {
                DynamicObject::ChangeType((DynamicObject *)intArray);
              }
              else {
                (*pDVar14->_vptr_DynamicTypeHandler[0x4a])(pDVar14,intArray);
              }
            }
            this_01 = RecyclableObject::GetType((RecyclableObject *)intArray);
            Js::Type::SetTypeId(this_01,TypeIds_ArrayLast);
          }
          BVar4 = CrossSite::IsCrossSiteObjectTyped<Js::JavascriptNativeIntArray>(intArray);
          if (BVar4 == 0) {
            bVar3 = VirtualTableInfo<Js::JavascriptNativeIntArray>::HasVirtualTable(intArray);
            if (!bVar3) {
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar7 = 1;
              bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                          ,0x716,
                                          "(VirtualTableInfo<JavascriptNativeIntArray>::HasVirtualTable(intArray))"
                                          ,
                                          "VirtualTableInfo<JavascriptNativeIntArray>::HasVirtualTable(intArray)"
                                         );
              if (!bVar3) {
                pcVar2 = (code *)invalidInstructionException();
                (*pcVar2)();
              }
              puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar7 = 0;
            }
            VirtualTableInfo<Js::JavascriptNativeFloatArray>::SetVirtualTable(intArray);
          }
          else {
            bVar3 = VirtualTableInfo<Js::CrossSiteObject<Js::JavascriptNativeIntArray>_>::
                    HasVirtualTable(intArray);
            if (!bVar3) {
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar7 = 1;
              bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                          ,0x711,
                                          "(VirtualTableInfo<CrossSiteObject<JavascriptNativeIntArray>>::HasVirtualTable(intArray))"
                                          ,
                                          "VirtualTableInfo<CrossSiteObject<JavascriptNativeIntArray>>::HasVirtualTable(intArray)"
                                         );
              if (!bVar3) {
                pcVar2 = (code *)invalidInstructionException();
                (*pcVar2)();
              }
              puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar7 = 0;
            }
            VirtualTableInfo<Js::CrossSiteObject<Js::JavascriptNativeFloatArray>_>::SetVirtualTable
                      (intArray);
          }
          AutoDisableInterrupt::Completed((AutoDisableInterrupt *)&recycler);
          AutoDisableInterrupt::~AutoDisableInterrupt((AutoDisableInterrupt *)&recycler);
          JsReentLock::~JsReentLock((JsReentLock *)&arrayInfo);
          return (JavascriptNativeFloatArray *)intArray;
        }
        ppSVar9 = Memory::WriteBarrierPtr::operator_cast_to_SparseArraySegmentBase__
                            ((WriteBarrierPtr *)&nextSeg->next);
        nextSeg_00 = *ppSVar9;
      } while (nextSeg->size == 0);
      left_00 = nextSeg->left;
      length_00 = nextSeg->length;
      uVar1 = nextSeg->size;
      ppSVar9 = Memory::WriteBarrierPtr::operator_cast_to_SparseArraySegmentBase__
                          ((WriteBarrierPtr *)
                           &(intArray->super_JavascriptNativeArray).super_JavascriptArray.head);
      if ((nextSeg == *ppSVar9) || (uVar1 >> 2 < nextSeg->length)) break;
      nextSeg->size = uVar1 >> 2;
      SparseArraySegmentBase::CheckLengthvsSize(nextSeg);
      newSegSize = nextSeg->length;
      while (newSegSize = newSegSize - 1, -1 < (int)newSegSize) {
        if ((&nextSeg[1].left)[(int)newSegSize] == 0xfff80002) {
          *(double *)(&nextSeg[1].left + (long)(int)newSegSize * 2) =
               JavascriptNativeFloatArray::MissingItem;
        }
        else {
          *(double *)(&nextSeg[1].left + (long)(int)newSegSize * 2) =
               (double)(int)(&nextSeg[1].left)[(int)newSegSize];
        }
      }
      _left = nextSeg;
    }
    segment = &SparseArraySegment<double>::AllocateSegment(recycler_00,left_00,length_00,nextSeg_00)
               ->super_SparseArraySegmentBase;
    if (segment == (SparseArraySegmentBase *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                  ,0x6c5,"(newSeg != nullptr)","newSeg != nullptr");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 0;
    }
    ppSVar9 = Memory::WriteBarrierPtr::operator_cast_to_SparseArraySegmentBase__
                        ((WriteBarrierPtr *)
                         &(intArray->super_JavascriptNativeArray).super_JavascriptArray.head);
    if ((_left == (SparseArraySegmentBase *)0x0) != (nextSeg == *ppSVar9)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                  ,0x6c6,"((prevSeg == nullptr) == (seg == intArray->head))",
                                  "(prevSeg == nullptr) == (seg == intArray->head)");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 0;
    }
    Memory::WriteBarrierPtr<Js::SparseArraySegmentBase>::operator=(&segment->next,nextSeg_00);
    Js::JavascriptArray::LinkSegments<double>
              ((JavascriptArray *)intArray,(SparseArraySegment<double> *)_left,
               (SparseArraySegment<double> *)segment);
    pSVar10 = Js::JavascriptArray::GetLastUsedSegment((JavascriptArray *)intArray);
    if (pSVar10 == nextSeg) {
      Js::JavascriptArray::SetLastUsedSegment((JavascriptArray *)intArray,segment);
    }
    this_00 = Js::JavascriptArray::GetSegmentMap((JavascriptArray *)intArray);
    if (this_00 != (SegmentBTreeRoot *)0x0) {
      SegmentBTree::SwapSegment(&this_00->super_SegmentBTree,left_00,nextSeg,segment);
    }
    for (newSegSize = 0; _left = segment, newSegSize < segment->length; newSegSize = newSegSize + 1)
    {
      if ((&nextSeg[1].left)[(int)newSegSize] == 0xfff80002) {
        ppSVar9 = Memory::WriteBarrierPtr::operator_cast_to_SparseArraySegmentBase__
                            ((WriteBarrierPtr *)
                             &(intArray->super_JavascriptNativeArray).super_JavascriptArray.head);
        if ((segment == *ppSVar9) &&
           (bVar3 = Js::JavascriptArray::HasNoMissingValues((JavascriptArray *)intArray), bVar3)) {
          ppSVar9 = Memory::WriteBarrierPtr::operator_cast_to_SparseArraySegmentBase__
                              ((WriteBarrierPtr *)
                               &(intArray->super_JavascriptNativeArray).super_JavascriptArray.head);
          if ((segment == *ppSVar9) &&
             (bVar3 = Js::JavascriptArray::HasNoMissingValues((JavascriptArray *)intArray), bVar3))
          {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar7 = 1;
            bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                        ,0x6da,
                                        "((newSeg != intArray->head || !intArray->HasNoMissingValues()))"
                                        ,"Unexpected missing item during array conversion");
            if (!bVar3) {
              pcVar2 = (code *)invalidInstructionException();
              (*pcVar2)();
            }
            puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar7 = 0;
          }
          Throw::FatalInternalError(-0x7fffbffb);
        }
      }
      else {
        *(double *)(&segment[1].left + (long)(int)newSegSize * 2) =
             (double)(int)(&nextSeg[1].left)[(int)newSegSize];
      }
    }
  } while( true );
}

Assistant:

JavascriptNativeFloatArray *JavascriptNativeIntArray::ToNativeFloatArray(JavascriptNativeIntArray *intArray)
    {
        ScriptContext *scriptContext = intArray->GetScriptContext();
        JIT_HELPER_NOT_REENTRANT_HEADER(IntArr_ToNativeFloatArray, reentrancylock, scriptContext->GetThreadContext());
#if ENABLE_PROFILE_INFO
        ArrayCallSiteInfo *arrayInfo = intArray->GetArrayCallSiteInfo();
        if (arrayInfo)
        {
#if DBG
            Js::JavascriptStackWalker walker(intArray->GetScriptContext());
            Js::JavascriptFunction* caller = nullptr;
            bool foundScriptCaller = false;
            while(walker.GetCaller(&caller))
            {
                if(caller != nullptr && Js::ScriptFunction::Test(caller))
                {
                    foundScriptCaller = true;
                    break;
                }
            }

            if(foundScriptCaller)
            {
                Assert(caller);
                Assert(caller->GetFunctionBody());
                if(PHASE_TRACE(Js::NativeArrayConversionPhase, caller->GetFunctionBody()))
                {
                    Output::Print(_u("Conversion: Int array to Float array    ArrayCreationFunctionNumber:%2d    CallSiteNumber:%2d \n"), arrayInfo->functionNumber, arrayInfo->callSiteNumber);
                    Output::Flush();
                }
            }
            else
            {
                if(PHASE_TRACE1(Js::NativeArrayConversionPhase))
                {
                    Output::Print(_u("Conversion: Int array to Float array across ScriptContexts"));
                    Output::Flush();
                }
            }
#else
            if(PHASE_TRACE1(Js::NativeArrayConversionPhase))
            {
                Output::Print(_u("Conversion: Int array to Float array"));
                Output::Flush();
            }
#endif

            arrayInfo->SetIsNotNativeIntArray();
        }
#endif


        // Code below has potential to throw due to OOM or SO. Just FailFast on those cases
        AutoDisableInterrupt failFastError(scriptContext->GetThreadContext());

        // Grow the segments
        Recycler *recycler = scriptContext->GetRecycler();
        SparseArraySegmentBase *seg, *nextSeg, *prevSeg = nullptr;
        for (seg = intArray->head; seg; seg = nextSeg)
        {
            nextSeg = seg->next;
            uint32 size = seg->size;
            if (size == 0)
            {
                continue;
            }

            uint32 left = seg->left;
            uint32 length = seg->length;
            int i;
            int32 ival;

            // The old segment will have size/2 and length capped by the new size.
            uint32 newSegSize = seg->size >> 1;
            if (seg == intArray->head || seg->length > (newSegSize >> 1))
            {
                // Some live elements are being pushed out of this segment, so allocate a new one.
                SparseArraySegment<double> *newSeg =
                    SparseArraySegment<double>::AllocateSegment(recycler, left, length, nextSeg);
                Assert(newSeg != nullptr);
                Assert((prevSeg == nullptr) == (seg == intArray->head));
                newSeg->next = nextSeg;
                intArray->LinkSegments((SparseArraySegment<double>*)prevSeg, newSeg);
                if (intArray->GetLastUsedSegment() == seg)
                {
                    intArray->SetLastUsedSegment(newSeg);
                }
                prevSeg = newSeg;
                SegmentBTree * segmentMap = intArray->GetSegmentMap();
                if (segmentMap)
                {
                    segmentMap->SwapSegment(left, seg, newSeg);
                }

                // Fill the new segment with the overflow.
                for (i = 0; (uint)i < newSeg->length; i++)
                {
                    ival = ((SparseArraySegment<int32>*)seg)->elements[i /*+ seg->length*/];
                    if (ival == JavascriptNativeIntArray::MissingItem)
                    {
                        AssertMsgAndFailFast(newSeg != intArray->head || !intArray->HasNoMissingValues(), "Unexpected missing item during array conversion");
                        continue;
                    }
                    newSeg->elements[i] = (double)ival;
                }
            }
            else
            {
                seg->size = newSegSize >> 1;
                seg->CheckLengthvsSize();

                // Now convert the contents that will remain in the old segment.
                for (i = seg->length - 1; i >= 0; i--)
                {
                    ival = ((SparseArraySegment<int32>*)seg)->elements[i];
                    if (ival == JavascriptNativeIntArray::MissingItem)
                    {
                        ((SparseArraySegment<double>*)seg)->elements[i] = (double)JavascriptNativeFloatArray::MissingItem;
                    }
                    else
                    {
                        ((SparseArraySegment<double>*)seg)->elements[i] = (double)ival;
                    }
                }
                prevSeg = seg;
            }
        }

        if (intArray->GetType() == scriptContext->GetLibrary()->GetNativeIntArrayType())
        {
            intArray->type = scriptContext->GetLibrary()->GetNativeFloatArrayType();
        }
        else
        {
            if (intArray->GetDynamicType()->GetIsLocked())
            {
                DynamicTypeHandler *typeHandler = intArray->GetDynamicType()->GetTypeHandler();
                if (typeHandler->IsPathTypeHandler())
                {
                    // We can't allow a type with the new type ID to be promoted to the old type.
                    // So go to a dictionary type handler, which will orphan the new type.
                    // This should be a corner case, so the inability to share the new type is unlikely to matter.
                    // If it does matter, try building a path from the new type's built-in root.
                    static_cast<PathTypeHandlerBase*>(typeHandler)->ResetTypeHandler(intArray);
                }
                else
                {
                    intArray->ChangeType();
                }
            }
            intArray->GetType()->SetTypeId(TypeIds_NativeFloatArray);
        }

        if (CrossSite::IsCrossSiteObjectTyped(intArray))
        {
            Assert(VirtualTableInfo<CrossSiteObject<JavascriptNativeIntArray>>::HasVirtualTable(intArray));
            VirtualTableInfo<CrossSiteObject<JavascriptNativeFloatArray>>::SetVirtualTable(intArray);
        }
        else
        {
            Assert(VirtualTableInfo<JavascriptNativeIntArray>::HasVirtualTable(intArray));
            VirtualTableInfo<JavascriptNativeFloatArray>::SetVirtualTable(intArray);
        }

        failFastError.Completed();
        return (JavascriptNativeFloatArray*)intArray;
        JIT_HELPER_END(IntArr_ToNativeFloatArray);
    }